

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_library.hpp
# Opt level: O2

bool __thiscall
rtw::DynamicLibrary::load
          (DynamicLibrary *this,
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *search_paths)

{
  string *path;
  _Elt_pointer pbVar1;
  void *pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Elt_pointer this_00;
  undefined1 local_88 [8];
  string full_path;
  _Elt_pointer local_40;
  _Map_pointer local_38;
  
  if (this->library_ != (void *)0x0) {
    dlclose();
  }
  this_00 = (search_paths->
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar1 = (search_paths->
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pbVar1 != this_00) {
    local_40 = (search_paths->
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_last;
    local_38 = (search_paths->
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_node;
    path = (string *)(full_path.field_2._M_local_buf + 8);
    while (this_00 != pbVar1) {
      std::__cxx11::string::string((string *)path,(string *)this);
      fs::join<std::__cxx11::string>((string *)local_88,(fs *)this_00,path,in_RCX);
      std::__cxx11::string::~string((string *)path);
      pvVar2 = dylib::load((string *)local_88);
      this->library_ = pvVar2;
      std::__cxx11::string::~string((string *)local_88);
      if (pvVar2 != (void *)0x0) {
        return true;
      }
      this_00 = this_00 + 1;
      if (this_00 == local_40) {
        this_00 = local_38[1];
        local_38 = local_38 + 1;
        local_40 = this_00 + 0x10;
      }
    }
  }
  pvVar2 = dylib::load(&this->name_);
  this->library_ = pvVar2;
  return pvVar2 != (void *)0x0;
}

Assistant:

inline bool DynamicLibrary::load(const std::deque<std::string> & search_paths)
{
	if(library_)
	{
		dylib::close(library_);
	}

	if(!search_paths.empty())
	{
		for(const auto & search_path : search_paths)
		{
			const auto full_path = fs::join(search_path, name_);

			library_ = dylib::load(full_path);

			if(library_) return true;
		}
	}

	return (library_ = dylib::load(name_)) != nullptr;
}